

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall helics::FederateState::timeoutCheck(FederateState *this,ActionMessage *cmd)

{
  int iVar1;
  bool bVar2;
  int32_t iVar3;
  GlobalFederateId GVar4;
  TimeRepresentation<count_time<9,_long>_> *this_00;
  ActionMessage *this_01;
  long in_RSI;
  long in_RDI;
  pair<helics::GlobalFederateId,_TimeRepresentation<count_time<9,_long>_>_> pVar5;
  __sv_type logMessageSource;
  __sv_type message;
  ActionMessage brokerTimeoutCheck;
  GlobalFederateId parentID;
  string qres;
  pair<helics::GlobalFederateId,_TimeRepresentation<count_time<9,_long>_>_> blockFed;
  FederateState *in_stack_00000718;
  string_view in_stack_00000720;
  undefined4 in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa5c;
  ActionMessage *in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffa6c;
  undefined4 uVar6;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffa70;
  ActionMessage *in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa84;
  undefined4 in_stack_fffffffffffffa88;
  TimeCoordinator *in_stack_fffffffffffffa90;
  FederateState *this_02;
  bool local_539;
  ActionMessage *in_stack_fffffffffffffb48;
  int32_t in_stack_fffffffffffffb54;
  MessageTimer *in_stack_fffffffffffffb58;
  nanoseconds in_stack_fffffffffffffb60;
  TimeRepresentation<count_time<9,_long>_> local_430;
  undefined1 local_424 [12];
  _Prime_rehash_policy local_418;
  undefined1 in_stack_fffffffffffffc03;
  int in_stack_fffffffffffffc04;
  FederateState *in_stack_fffffffffffffc08;
  string_view in_stack_fffffffffffffc10;
  string_view in_stack_fffffffffffffc20;
  format_args in_stack_fffffffffffffcc0;
  string_view in_stack_fffffffffffffcd0;
  GlobalFederateId local_30c;
  __sv_type local_308;
  __sv_type local_2f8;
  undefined1 local_2d8 [80];
  __sv_type local_288;
  __node_base_ptr local_278;
  __node_base_ptr local_270;
  __node_base local_268;
  undefined1 local_260 [32];
  __sv_type local_240;
  __sv_type local_230;
  BaseType local_20c;
  undefined1 local_208 [24];
  undefined1 local_1f0 [32];
  __sv_type local_1d0;
  __sv_type local_1c0;
  GlobalFederateId local_1b0 [2];
  __node_base local_1a8;
  TimeRepresentation<count_time<9,_long>_> local_1a0;
  long local_198;
  undefined1 local_188 [32];
  __node_base_ptr local_168;
  _Hash_node_base *p_Stack_160;
  __node_base_ptr *local_158;
  __node_base_ptr local_150;
  undefined1 auStack_148 [32];
  undefined1 local_128 [16];
  undefined8 local_118;
  pointer local_110;
  pointer local_108;
  pointer puStack_100;
  BaseType *local_f0;
  __node_base local_e8;
  char *local_e0;
  _Prime_rehash_policy _Stack_d8;
  _Hash_node_base local_c8 [2];
  size_type local_b8;
  __node_base local_b0;
  char *local_a8;
  _Prime_rehash_policy _Stack_a0;
  __node_base_ptr local_90;
  pthread_rwlock_t local_88;
  __uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_> local_50;
  pointer local_48;
  __node_base_ptr local_40;
  CommonCore *local_38;
  CommonCore *local_30;
  _Alloc_hider local_28;
  pointer local_20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_18;
  time_point local_8;
  
  local_539 = false;
  local_198 = in_RSI;
  if ((*(byte *)(in_RDI + 0x2fc) & 1) != 0) {
    local_1a0 = TimeRepresentation<count_time<9,_long>_>::maxVal();
    local_539 = TimeRepresentation<count_time<9,_long>_>::operator!=
                          ((TimeRepresentation<count_time<9,_long>_> *)(in_RSI + 0x20),&local_1a0);
  }
  if ((local_539 == false) &&
     (iVar1 = *(int *)(in_RDI + 0x300),
     iVar3 = ActionMessage::getExtraData((ActionMessage *)0x5828c2), iVar1 == iVar3)) {
    if (*(short *)(local_198 + 0x18) == 0) {
      std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
      operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                  *)0x5828f4);
      pVar5 = TimeCoordinator::getMinGrantedDependency(in_stack_fffffffffffffa90);
      local_1a8._M_nxt = (_Hash_node_base *)pVar5.second.internalTimeCode;
      local_1b0[0] = pVar5.first.gid;
      bVar2 = GlobalFederateId::isValid(local_1b0);
      if (bVar2) {
        local_1c0 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffa60);
        local_208._8_8_ = "grant timeout exceeded sim time {} waiting on {}";
        local_208._16_8_ = 0x30;
        local_208._0_8_ =
             TimeRepresentation::operator_cast_to_double
                       ((TimeRepresentation<count_time<9,_long>_> *)0x582969);
        local_20c = GlobalFederateId::baseValue(local_1b0);
        _Stack_d8._M_next_resize = (size_t)local_1f0;
        local_e0 = (char *)local_208._8_8_;
        _Stack_d8._0_8_ = local_208._16_8_;
        local_e8._M_nxt = (_Hash_node_base *)local_208;
        local_f0 = &local_20c;
        local_108 = (pointer)local_208._8_8_;
        puStack_100 = (pointer)local_208._16_8_;
        local_50._M_t.
        super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>.
        super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl =
             (tuple<helics::LogManager_*,_std::default_delete<helics::LogManager>_>)
             (tuple<helics::LogManager_*,_std::default_delete<helics::LogManager>_>)local_208._0_8_;
        local_48 = (pointer)(auStack_148 + 0x10);
        auStack_148._16_8_ = local_208._0_8_;
        local_88._48_8_ = local_128;
        local_18._M_allocated_capacity = (size_type)&local_118;
        local_118 = 0x1a;
        local_20 = local_48;
        local_110 = local_48;
        ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc0);
        local_1d0 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffa60);
        in_stack_fffffffffffffa58 = 0;
        logMessage(in_stack_fffffffffffffc08,in_stack_fffffffffffffc04,in_stack_fffffffffffffc20,
                   in_stack_fffffffffffffc10,(bool)in_stack_fffffffffffffc03);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa60);
      }
      else {
        local_230 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffa60);
        local_270 = (__node_base_ptr)0x810a9c;
        local_268._M_nxt = (_Hash_node_base *)0x22;
        local_278 = (__node_base_ptr)
                    TimeRepresentation::operator_cast_to_double
                              ((TimeRepresentation<count_time<9,_long>_> *)0x582b83);
        auStack_148._8_8_ = local_260;
        local_150 = local_270;
        auStack_148._0_8_ = local_268._M_nxt;
        local_158 = &local_278;
        local_168 = local_270;
        p_Stack_160 = local_268._M_nxt;
        local_38 = (CommonCore *)local_188;
        local_28._M_p = local_188 + 0x10;
        local_188._16_8_ = 10;
        local_40 = local_278;
        local_30 = local_38;
        local_188._0_8_ = local_278;
        local_188._24_8_ = local_38;
        ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc0);
        local_240 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffa60);
        in_stack_fffffffffffffa58 = 0;
        logMessage(in_stack_fffffffffffffc08,in_stack_fffffffffffffc04,in_stack_fffffffffffffc20,
                   in_stack_fffffffffffffc10,(bool)in_stack_fffffffffffffc03);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa60);
      }
    }
    else if (*(short *)(local_198 + 0x18) == 3) {
      local_288 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffa60);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffa70,
                 (char *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      in_stack_fffffffffffffa58 = 0;
      logMessage(in_stack_fffffffffffffc08,in_stack_fffffffffffffc04,in_stack_fffffffffffffc20,
                 in_stack_fffffffffffffc10,(bool)in_stack_fffffffffffffc03);
      std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
      operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                  *)0x582d8c);
      TimeCoordinator::requestTimeCheck((TimeCoordinator *)in_stack_fffffffffffffb60.__r);
    }
    else if (*(short *)(local_198 + 0x18) == 6) {
      local_2d8._48_16_ =
           (undefined1  [16])
           std::__cxx11::string::operator_cast_to_basic_string_view
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffa60);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffa70,
                 (char *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      logMessage(in_stack_fffffffffffffc08,in_stack_fffffffffffffc04,in_stack_fffffffffffffc20,
                 in_stack_fffffffffffffc10,(bool)in_stack_fffffffffffffc03);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffa70,
                 (char *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      this_02 = (FederateState *)local_2d8;
      processQueryActual_abi_cxx11_(in_stack_00000718,in_stack_00000720);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                 (size_type)in_stack_fffffffffffffa78,(char *)in_stack_fffffffffffffa70);
      local_2f8 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffa60);
      local_308 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffa60);
      in_stack_fffffffffffffa58 = 0;
      logMessage(in_stack_fffffffffffffc08,in_stack_fffffffffffffc04,in_stack_fffffffffffffc20,
                 in_stack_fffffffffffffc10,(bool)in_stack_fffffffffffffc03);
      std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
      operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                  *)0x582ee9);
      GVar4 = BaseTimeCoordinator::getParent((BaseTimeCoordinator *)in_stack_fffffffffffffa78);
      local_30c = GVar4;
      bVar2 = GlobalFederateId::isValid(&local_30c);
      uVar6 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffa88);
      if (bVar2) {
        ActionMessage::ActionMessage
                  ((ActionMessage *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                   in_stack_fffffffffffffa78);
        std::atomic<helics::GlobalFederateId>::load
                  ((atomic<helics::GlobalFederateId> *)(in_RDI + 0x2c),seq_cst);
        routeMessage(this_02,(ActionMessage *)CONCAT44(GVar4.gid,uVar6));
        logMessageSource =
             std::__cxx11::string::operator_cast_to_basic_string_view
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffffa60);
        local_424._4_8_ = "sending grant time out check to {}";
        local_418._M_max_load_factor = 4.76441e-44;
        local_418._4_4_ = 0;
        local_424._0_4_ = GlobalFederateId::baseValue(&local_30c);
        local_88._16_8_ = &local_418._M_next_resize;
        local_88.__align = local_424._4_8_;
        local_88._8_8_ = local_418._0_8_;
        local_90 = (__node_base_ptr)local_424;
        local_a8 = (char *)local_424._4_8_;
        _Stack_a0._M_max_load_factor = local_418._M_max_load_factor;
        _Stack_a0._4_4_ = local_418._4_4_;
        local_88._32_8_ = local_c8;
        local_8.__d.__r = (duration)&local_b8;
        local_b8 = 1;
        local_88.__data.__shared = local_424._0_4_;
        local_18._8_8_ = local_88._32_8_;
        local_c8[0]._M_nxt._0_4_ = local_424._0_4_;
        local_b0._M_nxt = (_Hash_node_base *)local_88._32_8_;
        ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc0);
        message = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffa60);
        in_stack_fffffffffffffa58 = 0;
        logMessage(in_stack_fffffffffffffc08,in_stack_fffffffffffffc04,(string_view)logMessageSource
                   ,(string_view)message,(bool)in_stack_fffffffffffffc03);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa60);
        ActionMessage::~ActionMessage(in_stack_fffffffffffffa60);
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa60);
    }
    else if (*(short *)(local_198 + 0x18) == 10) {
      this_00 = (TimeRepresentation<count_time<9,_long>_> *)(local_198 + 0x20);
      local_430 = TimeRepresentation<count_time<9,_long>_>::maxVal();
      bVar2 = TimeRepresentation<count_time<9,_long>_>::operator==(this_00,&local_430);
      if (bVar2) {
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa60);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffa70,
                   (char *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
        in_stack_fffffffffffffa58 = 0;
        logMessage(in_stack_fffffffffffffc08,in_stack_fffffffffffffc04,in_stack_fffffffffffffc20,
                   in_stack_fffffffffffffc10,(bool)in_stack_fffffffffffffc03);
      }
      else {
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa60);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffa70,
                   (char *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
        in_stack_fffffffffffffa58 = 0;
        logMessage(in_stack_fffffffffffffc08,in_stack_fffffffffffffc04,in_stack_fffffffffffffc20,
                   in_stack_fffffffffffffc10,(bool)in_stack_fffffffffffffc03);
      }
    }
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x308));
    if (bVar2) {
      *(short *)(local_198 + 0x18) = *(short *)(local_198 + 0x18) + 1;
      this_01 = (ActionMessage *)
                std::
                __shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x58330c);
      uVar6 = *(undefined4 *)(in_RDI + 0x2f4);
      TimeRepresentation<count_time<9,_long>_>::to_ms
                ((TimeRepresentation<count_time<9,_long>_> *)
                 CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::
      duration<long,std::ratio<1l,1000l>,void>
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffa70,
                 (duration<long,_std::ratio<1L,_1000L>_> *)CONCAT44(uVar6,in_stack_fffffffffffffa68)
                );
      ActionMessage::ActionMessage
                (this_01,(ActionMessage *)
                         CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      MessageTimer::updateTimerFromNow
                (in_stack_fffffffffffffb58,in_stack_fffffffffffffb54,in_stack_fffffffffffffb60,
                 in_stack_fffffffffffffb48);
      ActionMessage::~ActionMessage(this_01);
    }
  }
  return;
}

Assistant:

void FederateState::timeoutCheck(ActionMessage& cmd)
{
    if (timeGranted_mode && cmd.actionTime != Time::maxVal()) {
        return;
    }
    if (mGrantCount != static_cast<std::uint32_t>(cmd.getExtraData())) {
        // time has been granted since this was triggered
        return;
    }
    if (cmd.counter == 0) {
        auto blockFed = timeCoord->getMinGrantedDependency();
        if (blockFed.first.isValid()) {
            LOG_WARNING(fmt::format("grant timeout exceeded sim time {} waiting on {}",
                                    static_cast<double>(time_granted),
                                    blockFed.first.baseValue()));
        } else {
            LOG_WARNING(fmt::format("grant timeout exceeded sim time {}",
                                    static_cast<double>(time_granted)));
        }

    } else if (cmd.counter == 3) {
        LOG_WARNING("grant timeout stage 2 requesting time resend");
        timeCoord->requestTimeCheck();
    } else if (cmd.counter == 6) {
        LOG_WARNING("grant timeout stage 3 diagnostics");
        auto qres = processQueryActual("global_time_debugging");
        qres.insert(0, "TIME DEBUGGING::");
        LOG_WARNING(qres);
        auto parentID = timeCoord->getParent();
        if (parentID.isValid()) {
            ActionMessage brokerTimeoutCheck{cmd};
            brokerTimeoutCheck.source_id = global_id.load();
            brokerTimeoutCheck.dest_id = parentID;
            routeMessage(brokerTimeoutCheck);
            LOG_WARNING(fmt::format("sending grant time out check to {}", parentID.baseValue()));
        }
    } else if (cmd.counter == 10) {
        if (cmd.actionTime == Time::maxVal()) {
            LOG_WARNING("finalize blocking");
        } else {
            LOG_WARNING("grant timeout stage 4 error actions (none available)");
        }
    }
#ifndef HELICS_DISABLE_ASIO
    if (mTimer) {
        ++cmd.counter;
        mTimer->updateTimerFromNow(grantTimeoutTimeIndex,
                                   grantTimeOutPeriod.to_ms(),
                                   std::move(cmd));
    }
#endif
}